

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyrsa.cpp
# Opt level: O1

bool RSASign(RSA *rsa,uchar *Msg,size_t MsgLen,uchar **EncMsg,size_t *MsgLenEnc)

{
  int iVar1;
  EVP_MD_CTX *ctx;
  EVP_PKEY *pkey;
  EVP_MD *type;
  uchar *sigret;
  
  ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
  pkey = EVP_PKEY_new();
  EVP_PKEY_assign(pkey,6,rsa);
  type = EVP_sha256();
  iVar1 = EVP_DigestSignInit(ctx,(EVP_PKEY_CTX **)0x0,type,(ENGINE *)0x0,pkey);
  if (((iVar1 < 1) || (iVar1 = EVP_DigestSignUpdate(ctx,Msg,MsgLen), iVar1 < 1)) ||
     (iVar1 = EVP_DigestSignFinal(ctx,(uchar *)0x0,MsgLenEnc), iVar1 < 1)) {
    EVP_PKEY_free(pkey);
  }
  else {
    sigret = (uchar *)malloc(*MsgLenEnc);
    *EncMsg = sigret;
    iVar1 = EVP_DigestSignFinal(ctx,sigret,MsgLenEnc);
    EVP_PKEY_free(pkey);
    if (0 < iVar1) {
      EVP_MD_CTX_free(ctx);
      return true;
    }
  }
  return false;
}

Assistant:

bool RSASign( RSA* rsa,
              const unsigned char* Msg,
              size_t MsgLen,
              unsigned char** EncMsg,
              size_t* MsgLenEnc) {
  EVP_MD_CTX* m_RSASignCtx = EVP_MD_CTX_create();
  EVP_PKEY* priKey  = EVP_PKEY_new();
  EVP_PKEY_assign_RSA(priKey, rsa);
  if (EVP_DigestSignInit(m_RSASignCtx,
                         NULL,
                         EVP_sha256(),
                         NULL,
                         priKey)<=0)
  {
      EVP_PKEY_free(priKey);
      return false;
  }
  if (EVP_DigestSignUpdate(m_RSASignCtx,
                           Msg,
                           MsgLen) <= 0)
  {
      EVP_PKEY_free(priKey);
      return false;
  }
  if (EVP_DigestSignFinal(m_RSASignCtx,
                          NULL,
                          MsgLenEnc) <=0)
  {
      EVP_PKEY_free(priKey);
      return false;
  }
  *EncMsg = reinterpret_cast<unsigned char*>(malloc(*MsgLenEnc));
  if (EVP_DigestSignFinal(m_RSASignCtx,
                          *EncMsg,
                          MsgLenEnc) <= 0)
  {
      EVP_PKEY_free(priKey);
      return false;
  }
  EVP_PKEY_free(priKey);
  EVP_MD_CTX_free(m_RSASignCtx);
  return true;
}